

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

path * __thiscall boost::filesystem::path::replace_extension(path *this,path *new_extension)

{
  size_type sVar1;
  undefined8 uVar2;
  char *pcVar3;
  ulong uVar4;
  path local_40;
  
  sVar1 = (this->m_pathname)._M_string_length;
  extension(&local_40,this);
  uVar4 = sVar1 - local_40.m_pathname._M_string_length;
  if (uVar4 <= (this->m_pathname)._M_string_length) {
    (this->m_pathname)._M_string_length = uVar4;
    (this->m_pathname)._M_dataplus._M_p[uVar4] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.m_pathname._M_dataplus._M_p != &local_40.m_pathname.field_2) {
      operator_delete(local_40.m_pathname._M_dataplus._M_p,
                      local_40.m_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((new_extension->m_pathname)._M_string_length != 0) {
      pcVar3 = (new_extension->m_pathname)._M_dataplus._M_p;
      if (*pcVar3 != '.') {
        std::__cxx11::string::push_back((char)this);
        pcVar3 = (new_extension->m_pathname)._M_dataplus._M_p;
      }
      std::__cxx11::string::_M_append((char *)this,(ulong)pcVar3);
    }
    return this;
  }
  uVar2 = std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                     uVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_pathname._M_dataplus._M_p != &local_40.m_pathname.field_2) {
    operator_delete(local_40.m_pathname._M_dataplus._M_p,
                    local_40.m_pathname.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar2);
}

Assistant:

path& path::replace_extension(const path& new_extension)
  {
    // erase existing extension, including the dot, if any
    m_pathname.erase(m_pathname.size()-extension().m_pathname.size());

    if (!new_extension.empty())
    {
      // append new_extension, adding the dot if necessary
      if (new_extension.m_pathname[0] != dot)
        m_pathname.push_back(dot);
      m_pathname.append(new_extension.m_pathname);
    }

    return *this;
  }